

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_template.h
# Opt level: O0

uint32_t helper_atomic_xchgw_be_mipsel
                   (CPUArchState_conflict8 *env,target_ulong_conflict addr,uint32_t val,
                   TCGMemOpIdx oi)

{
  uint16_t uVar1;
  uint16_t uVar2;
  uint16_t *puVar3;
  uintptr_t unaff_retaddr;
  uint32_t ret;
  uint16_t *haddr;
  TCGMemOpIdx oi_local;
  uint32_t val_local;
  target_ulong_conflict addr_local;
  CPUArchState_conflict8 *env_local;
  
  puVar3 = (uint16_t *)atomic_mmu_lookup(env,addr,oi,unaff_retaddr);
  uVar2 = *puVar3;
  uVar1 = bswap16((uint16_t)val);
  *puVar3 = uVar1;
  uVar2 = bswap16(uVar2);
  return (uint32_t)uVar2;
}

Assistant:

ABI_TYPE ATOMIC_NAME(xchg)(CPUArchState *env, target_ulong addr,
                           ABI_TYPE val EXTRA_ARGS)
{
    ATOMIC_MMU_DECLS;
    DATA_TYPE *haddr = ATOMIC_MMU_LOOKUP;
    ABI_TYPE ret;
    ret = *haddr;
    *haddr = BSWAP(val);
    ATOMIC_MMU_CLEANUP;
    return BSWAP(ret);
}